

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

bool __thiscall httplib::Server::routing(Server *this,Request *req,Response *res,Stream *strm)

{
  pointer ppVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  _Any_data *p_Var3;
  Stream *strm_00;
  bool bVar4;
  HandlerResponse HVar5;
  int iVar6;
  int iVar7;
  undefined8 *puVar8;
  Handlers *handlers;
  function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>
  *pfVar9;
  pointer ppVar10;
  _Any_data *p_Var11;
  _Any_data *p_Var12;
  undefined8 *local_180;
  undefined8 uStack_178;
  code *local_170;
  code *pcStack_168;
  undefined8 *local_160;
  undefined8 uStack_158;
  code *local_150;
  code *pcStack_148;
  Stream *local_140;
  undefined8 *local_138;
  undefined8 uStack_130;
  code *local_128;
  code *local_120;
  undefined8 *local_118;
  undefined8 uStack_110;
  code *local_108;
  code *local_100;
  undefined8 *local_f8;
  undefined8 uStack_f0;
  code *local_e8;
  code *local_e0;
  undefined8 *local_d8;
  undefined8 uStack_d0;
  code *local_c8;
  code *local_c0;
  undefined8 *local_b8;
  undefined8 uStack_b0;
  code *local_a8;
  code *local_a0;
  undefined8 *local_98;
  undefined8 uStack_90;
  code *local_88;
  code *local_80;
  undefined8 *local_78;
  undefined8 uStack_70;
  code *local_68;
  code *local_60;
  undefined8 *local_58;
  undefined8 uStack_50;
  code *local_48;
  code *local_40;
  
  if (((this->pre_routing_handler_).super__Function_base._M_manager != (_Manager_type)0x0) &&
     (HVar5 = (*(this->pre_routing_handler_)._M_invoker)
                        ((_Any_data *)&this->pre_routing_handler_,req,res), HVar5 == Handled)) {
    return true;
  }
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&req->method,"HEAD");
  iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&req->method,"GET");
  if (((iVar6 == 0) || (iVar7 == 0)) &&
     (bVar4 = handle_file_request(this,req,res,iVar6 == 0), bVar4)) {
    return true;
  }
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&req->method,"POST");
  if (((iVar6 != 0) &&
      (iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               compare(&req->method,"PUT"), iVar6 != 0)) &&
     ((iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               compare(&req->method,"PATCH"), iVar6 != 0 &&
      ((iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&req->method,"PRI"), iVar6 != 0 &&
       (iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&req->method,"DELETE"), iVar6 != 0)))))) goto LAB_0015cee5;
  puVar8 = (undefined8 *)operator_new(0x20);
  *puVar8 = this;
  puVar8[1] = strm;
  puVar8[2] = req;
  puVar8[3] = res;
  local_160 = (undefined8 *)operator_new(0x20);
  *local_160 = this;
  local_160[1] = strm;
  local_160[2] = req;
  local_160[3] = res;
  pcStack_168 = std::
                _Function_handler<bool_(std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/cpp-httplib/httplib.h:5824:11)>
                ::_M_invoke;
  uStack_178 = 0;
  local_170 = std::
              _Function_handler<bool_(std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/cpp-httplib/httplib.h:5824:11)>
              ::_M_manager;
  pcStack_148 = std::
                _Function_handler<bool_(std::function<bool_(const_httplib::MultipartFormData_&)>,_std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/cpp-httplib/httplib.h:5828:11)>
                ::_M_invoke;
  uStack_158 = 0;
  local_150 = std::
              _Function_handler<bool_(std::function<bool_(const_httplib::MultipartFormData_&)>,_std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/cpp-httplib/httplib.h:5828:11)>
              ::_M_manager;
  local_180 = puVar8;
  local_140 = strm;
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&req->method,"POST");
  if (iVar6 == 0) {
    local_60 = std::
               _Function_handler<bool_(std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/cpp-httplib/httplib.h:5824:11)>
               ::_M_invoke;
    local_78 = local_180;
    uStack_70 = uStack_178;
    local_68 = std::
               _Function_handler<bool_(std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/cpp-httplib/httplib.h:5824:11)>
               ::_M_manager;
    local_170 = (code *)0x0;
    pcStack_168 = (code *)0x0;
    local_40 = std::
               _Function_handler<bool_(std::function<bool_(const_httplib::MultipartFormData_&)>,_std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/cpp-httplib/httplib.h:5828:11)>
               ::_M_invoke;
    local_58 = local_160;
    uStack_50 = uStack_158;
    local_48 = std::
               _Function_handler<bool_(std::function<bool_(const_httplib::MultipartFormData_&)>,_std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/cpp-httplib/httplib.h:5828:11)>
               ::_M_manager;
    local_150 = (code *)0x0;
    pcStack_148 = (code *)0x0;
    ppVar10 = (this->post_handlers_for_content_reader_).
              super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppVar1 = (this->post_handlers_for_content_reader_).
             super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar10 != ppVar1) {
      pfVar9 = &ppVar10->second;
      do {
        _Var2._M_current = (req->path)._M_dataplus._M_p;
        bVar4 = std::__detail::
                __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                          (_Var2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  )(_Var2._M_current + (req->path)._M_string_length),&req->matches,
                           (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)(pfVar9 + -0x20),
                           0);
        if (bVar4) {
          if (*(long *)(pfVar9 + 0x10) == 0) {
            std::__throw_bad_function_call();
          }
          bVar4 = true;
          (**(code **)(pfVar9 + 0x18))(pfVar9,req,res,&local_78);
          goto LAB_0015ccef;
        }
        ppVar10 = (pointer)(pfVar9 + 0x20);
        pfVar9 = pfVar9 + 0x40;
      } while (ppVar10 != ppVar1);
    }
    bVar4 = false;
LAB_0015ccef:
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,3);
    }
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,3);
    }
LAB_0015ce52:
    if (bVar4) {
      if (local_150 != (code *)0x0) {
        (*local_150)(&local_160,&local_160,3);
      }
      if (local_170 == (code *)0x0) {
        return true;
      }
      (*local_170)(&local_180,&local_180,3);
      return true;
    }
  }
  else {
    iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&req->method,"PUT");
    if (iVar6 == 0) {
      local_a0 = std::
                 _Function_handler<bool_(std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/cpp-httplib/httplib.h:5824:11)>
                 ::_M_invoke;
      local_b8 = local_180;
      uStack_b0 = uStack_178;
      local_a8 = std::
                 _Function_handler<bool_(std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/cpp-httplib/httplib.h:5824:11)>
                 ::_M_manager;
      local_170 = (code *)0x0;
      pcStack_168 = (code *)0x0;
      local_80 = std::
                 _Function_handler<bool_(std::function<bool_(const_httplib::MultipartFormData_&)>,_std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/cpp-httplib/httplib.h:5828:11)>
                 ::_M_invoke;
      local_98 = local_160;
      uStack_90 = uStack_158;
      local_88 = std::
                 _Function_handler<bool_(std::function<bool_(const_httplib::MultipartFormData_&)>,_std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/cpp-httplib/httplib.h:5828:11)>
                 ::_M_manager;
      local_150 = (code *)0x0;
      pcStack_148 = (code *)0x0;
      ppVar10 = (this->put_handlers_for_content_reader_).
                super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar1 = (this->put_handlers_for_content_reader_).
               super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (ppVar10 != ppVar1) {
        pfVar9 = &ppVar10->second;
        do {
          _Var2._M_current = (req->path)._M_dataplus._M_p;
          bVar4 = std::__detail::
                  __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                            (_Var2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    )(_Var2._M_current + (req->path)._M_string_length),&req->matches
                             ,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                              (pfVar9 + -0x20),0);
          if (bVar4) {
            if (*(long *)(pfVar9 + 0x10) == 0) {
              std::__throw_bad_function_call();
            }
            bVar4 = true;
            (**(code **)(pfVar9 + 0x18))(pfVar9,req,res,&local_b8);
            goto LAB_0015cd57;
          }
          ppVar10 = (pointer)(pfVar9 + 0x20);
          pfVar9 = pfVar9 + 0x40;
        } while (ppVar10 != ppVar1);
      }
      bVar4 = false;
LAB_0015cd57:
      if (local_88 != (code *)0x0) {
        (*local_88)(&local_98,&local_98,3);
      }
      if (local_a8 != (code *)0x0) {
        (*local_a8)(&local_b8,&local_b8,3);
      }
      goto LAB_0015ce52;
    }
    iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&req->method,"PATCH");
    if (iVar6 == 0) {
      local_e0 = std::
                 _Function_handler<bool_(std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/cpp-httplib/httplib.h:5824:11)>
                 ::_M_invoke;
      local_f8 = local_180;
      uStack_f0 = uStack_178;
      local_e8 = std::
                 _Function_handler<bool_(std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/cpp-httplib/httplib.h:5824:11)>
                 ::_M_manager;
      local_170 = (code *)0x0;
      pcStack_168 = (code *)0x0;
      local_c0 = std::
                 _Function_handler<bool_(std::function<bool_(const_httplib::MultipartFormData_&)>,_std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/cpp-httplib/httplib.h:5828:11)>
                 ::_M_invoke;
      local_d8 = local_160;
      uStack_d0 = uStack_158;
      local_c8 = std::
                 _Function_handler<bool_(std::function<bool_(const_httplib::MultipartFormData_&)>,_std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/cpp-httplib/httplib.h:5828:11)>
                 ::_M_manager;
      local_150 = (code *)0x0;
      pcStack_148 = (code *)0x0;
      ppVar10 = (this->patch_handlers_for_content_reader_).
                super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar1 = (this->patch_handlers_for_content_reader_).
               super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (ppVar10 != ppVar1) {
        pfVar9 = &ppVar10->second;
        do {
          _Var2._M_current = (req->path)._M_dataplus._M_p;
          bVar4 = std::__detail::
                  __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                            (_Var2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    )(_Var2._M_current + (req->path)._M_string_length),&req->matches
                             ,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                              (pfVar9 + -0x20),0);
          if (bVar4) {
            if (*(long *)(pfVar9 + 0x10) == 0) {
              std::__throw_bad_function_call();
            }
            bVar4 = true;
            (**(code **)(pfVar9 + 0x18))(pfVar9,req,res,&local_f8);
            goto LAB_0015cdbf;
          }
          ppVar10 = (pointer)(pfVar9 + 0x20);
          pfVar9 = pfVar9 + 0x40;
        } while (ppVar10 != ppVar1);
      }
      bVar4 = false;
LAB_0015cdbf:
      if (local_c8 != (code *)0x0) {
        (*local_c8)(&local_d8,&local_d8,3);
      }
      if (local_e8 != (code *)0x0) {
        (*local_e8)(&local_f8,&local_f8,3);
      }
      goto LAB_0015ce52;
    }
    iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&req->method,"DELETE");
    if (iVar6 == 0) {
      local_120 = std::
                  _Function_handler<bool_(std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/cpp-httplib/httplib.h:5824:11)>
                  ::_M_invoke;
      local_138 = local_180;
      uStack_130 = uStack_178;
      local_128 = std::
                  _Function_handler<bool_(std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/cpp-httplib/httplib.h:5824:11)>
                  ::_M_manager;
      local_170 = (code *)0x0;
      pcStack_168 = (code *)0x0;
      local_100 = std::
                  _Function_handler<bool_(std::function<bool_(const_httplib::MultipartFormData_&)>,_std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/cpp-httplib/httplib.h:5828:11)>
                  ::_M_invoke;
      local_118 = local_160;
      uStack_110 = uStack_158;
      local_108 = std::
                  _Function_handler<bool_(std::function<bool_(const_httplib::MultipartFormData_&)>,_std::function<bool_(const_char_*,_unsigned_long)>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/cpp-httplib/httplib.h:5828:11)>
                  ::_M_manager;
      local_150 = (code *)0x0;
      pcStack_148 = (code *)0x0;
      ppVar10 = (this->delete_handlers_for_content_reader_).
                super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar1 = (this->delete_handlers_for_content_reader_).
               super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&,_const_httplib::ContentReader_&)>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (ppVar10 != ppVar1) {
        pfVar9 = &ppVar10->second;
        do {
          _Var2._M_current = (req->path)._M_dataplus._M_p;
          bVar4 = std::__detail::
                  __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                            (_Var2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    )(_Var2._M_current + (req->path)._M_string_length),&req->matches
                             ,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                              (pfVar9 + -0x20),0);
          if (bVar4) {
            if (*(long *)(pfVar9 + 0x10) == 0) {
              std::__throw_bad_function_call();
            }
            bVar4 = true;
            (**(code **)(pfVar9 + 0x18))(pfVar9,req,res,&local_138);
            goto LAB_0015ce1d;
          }
          ppVar10 = (pointer)(pfVar9 + 0x20);
          pfVar9 = pfVar9 + 0x40;
        } while (ppVar10 != ppVar1);
      }
      bVar4 = false;
LAB_0015ce1d:
      if (local_108 != (code *)0x0) {
        (*local_108)(&local_118,&local_118,3);
      }
      if (local_128 != (code *)0x0) {
        (*local_128)(&local_138,&local_138,3);
      }
      goto LAB_0015ce52;
    }
  }
  if (local_150 != (code *)0x0) {
    (*local_150)(&local_160,&local_160,3);
  }
  strm_00 = local_140;
  if (local_170 != (code *)0x0) {
    (*local_170)(&local_180,&local_180,3);
  }
  bVar4 = read_content(this,strm_00,req,res);
  if (!bVar4) {
    return false;
  }
LAB_0015cee5:
  iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&req->method,"GET");
  if ((iVar6 != 0) &&
     (iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&req->method,"HEAD"), iVar6 != 0)) {
    iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&req->method,"POST");
    if (iVar6 == 0) {
      p_Var12 = (_Any_data *)
                (this->post_handlers_).
                super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      p_Var3 = (_Any_data *)
               (this->post_handlers_).
               super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (p_Var12 == p_Var3) {
        return false;
      }
      p_Var12 = (_Any_data *)(p_Var12->_M_pod_data + 0x20);
      while (_Var2._M_current = (req->path)._M_dataplus._M_p,
            bVar4 = std::__detail::
                    __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                              (_Var2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      )(_Var2._M_current + (req->path)._M_string_length),
                               &req->matches,
                               (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                               (p_Var12 + -2),0), !bVar4) {
        p_Var11 = p_Var12 + 2;
        p_Var12 = p_Var12 + 4;
        if (p_Var11 == p_Var3) {
          return false;
        }
      }
    }
    else {
      iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&req->method,"PUT");
      if (iVar6 != 0) {
        iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&req->method,"DELETE");
        if (iVar6 == 0) {
          handlers = &this->delete_handlers_;
        }
        else {
          iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&req->method,"OPTIONS");
          if (iVar6 == 0) {
            handlers = &this->options_handlers_;
          }
          else {
            iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare(&req->method,"PATCH");
            if (iVar6 != 0) {
              res->status = 400;
              return false;
            }
            handlers = &this->patch_handlers_;
          }
        }
        bVar4 = dispatch_request(this,req,res,handlers);
        return bVar4;
      }
      p_Var12 = (_Any_data *)
                (this->put_handlers_).
                super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      p_Var3 = (_Any_data *)
               (this->put_handlers_).
               super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (p_Var12 == p_Var3) {
        return false;
      }
      p_Var12 = (_Any_data *)(p_Var12->_M_pod_data + 0x20);
      while (_Var2._M_current = (req->path)._M_dataplus._M_p,
            bVar4 = std::__detail::
                    __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                              (_Var2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      )(_Var2._M_current + (req->path)._M_string_length),
                               &req->matches,
                               (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                               (p_Var12 + -2),0), !bVar4) {
        p_Var11 = p_Var12 + 2;
        p_Var12 = p_Var12 + 4;
        if (p_Var11 == p_Var3) {
          return false;
        }
      }
    }
LAB_0015d09a:
    if (*(long *)(p_Var12 + 1) != 0) {
      (**(code **)(p_Var12->_M_pod_data + 0x18))(p_Var12,req,res);
      return true;
    }
    std::__throw_bad_function_call();
  }
  p_Var12 = (_Any_data *)
            (this->get_handlers_).
            super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  p_Var3 = (_Any_data *)
           (this->get_handlers_).
           super__Vector_base<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>,_std::allocator<std::pair<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(const_httplib::Request_&,_httplib::Response_&)>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (p_Var12 != p_Var3) {
    p_Var12 = (_Any_data *)(p_Var12->_M_pod_data + 0x20);
    do {
      _Var2._M_current = (req->path)._M_dataplus._M_p;
      bVar4 = std::__detail::
              __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                        (_Var2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                )(_Var2._M_current + (req->path)._M_string_length),&req->matches,
                         (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)(p_Var12 + -2),0);
      if (bVar4) goto LAB_0015d09a;
      p_Var11 = p_Var12 + 2;
      p_Var12 = p_Var12 + 4;
    } while (p_Var11 != p_Var3);
  }
  return false;
}

Assistant:

inline bool Server::routing(Request &req, Response &res, Stream &strm) {
  if (pre_routing_handler_ &&
      pre_routing_handler_(req, res) == HandlerResponse::Handled) {
    return true;
  }

  // File handler
  bool is_head_request = req.method == "HEAD";
  if ((req.method == "GET" || is_head_request) &&
      handle_file_request(req, res, is_head_request)) {
    return true;
  }

  if (detail::expect_content(req)) {
    // Content reader handler
    {
      ContentReader reader(
          [&](ContentReceiver receiver) {
            return read_content_with_content_receiver(
                strm, req, res, std::move(receiver), nullptr, nullptr);
          },
          [&](MultipartContentHeader header, ContentReceiver receiver) {
            return read_content_with_content_receiver(strm, req, res, nullptr,
                                                      std::move(header),
                                                      std::move(receiver));
          });

      if (req.method == "POST") {
        if (dispatch_request_for_content_reader(
                req, res, std::move(reader),
                post_handlers_for_content_reader_)) {
          return true;
        }
      } else if (req.method == "PUT") {
        if (dispatch_request_for_content_reader(
                req, res, std::move(reader),
                put_handlers_for_content_reader_)) {
          return true;
        }
      } else if (req.method == "PATCH") {
        if (dispatch_request_for_content_reader(
                req, res, std::move(reader),
                patch_handlers_for_content_reader_)) {
          return true;
        }
      } else if (req.method == "DELETE") {
        if (dispatch_request_for_content_reader(
                req, res, std::move(reader),
                delete_handlers_for_content_reader_)) {
          return true;
        }
      }
    }

    // Read content into `req.body`
    if (!read_content(strm, req, res)) { return false; }
  }

  // Regular handler
  if (req.method == "GET" || req.method == "HEAD") {
    return dispatch_request(req, res, get_handlers_);
  } else if (req.method == "POST") {
    return dispatch_request(req, res, post_handlers_);
  } else if (req.method == "PUT") {
    return dispatch_request(req, res, put_handlers_);
  } else if (req.method == "DELETE") {
    return dispatch_request(req, res, delete_handlers_);
  } else if (req.method == "OPTIONS") {
    return dispatch_request(req, res, options_handlers_);
  } else if (req.method == "PATCH") {
    return dispatch_request(req, res, patch_handlers_);
  }

  res.status = 400;
  return false;
}